

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O0

REF_STATUS ref_shard_cell_add_local(REF_NODE ref_node,REF_CELL ref_cell,REF_INT *nodes)

{
  bool local_39;
  REF_INT local_34;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT new_cell;
  REF_INT node;
  REF_BOOL has_local;
  REF_INT *nodes_local;
  REF_CELL ref_cell_local;
  REF_NODE ref_node_local;
  
  new_cell = 0;
  for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ref_cell->node_per;
      ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
    local_39 = true;
    if (new_cell == 0) {
      local_39 = ref_node->ref_mpi->id == ref_node->part[nodes[ref_private_macro_code_rss]];
    }
    new_cell = (REF_INT)local_39;
  }
  if ((new_cell == 0) ||
     (_node = nodes, nodes_local = (REF_INT *)ref_cell, ref_cell_local = (REF_CELL)ref_node,
     ref_node_local._4_4_ = ref_cell_add(ref_cell,nodes,&local_34), ref_node_local._4_4_ == 0)) {
    ref_node_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x1c6,
           "ref_shard_cell_add_local",(ulong)ref_node_local._4_4_,"add");
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_cell_add_local(REF_NODE ref_node,
                                                   REF_CELL ref_cell,
                                                   REF_INT *nodes) {
  REF_BOOL has_local;
  REF_INT node, new_cell;

  has_local = REF_FALSE;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    has_local = has_local || (ref_mpi_rank(ref_node_mpi(ref_node)) ==
                              ref_node_part(ref_node, nodes[node]));

  if (has_local) RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add");

  return REF_SUCCESS;
}